

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::ARM::parseFPU(ARM *this,StringRef FPU)

{
  int iVar1;
  char *pcVar2;
  StringRef *pSVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcStack_50;
  char *local_38;
  char local_30 [8];
  bool local_28;
  
  pcStack_50 = FPU.Data;
  switch(pcStack_50) {
  case (char *)0x3:
    pcStack_50 = (char *)0x3;
    iVar1 = bcmp(this,"fpa",3);
    if (iVar1 != 0) goto switchD_00172861_caseD_5;
LAB_00172a15:
    uVar4._0_1_ = '\a';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar4._4_1_ = '\0';
    uVar4._5_1_ = '\0';
    uVar4._6_1_ = '\0';
    uVar4._7_1_ = '\0';
    pcVar2 = "invalid";
    break;
  case (char *)0x4:
    uVar4._0_1_ = '\a';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar4._4_1_ = '\0';
    uVar4._5_1_ = '\0';
    uVar4._6_1_ = '\0';
    uVar4._7_1_ = '\0';
    pcVar2 = "invalid";
    if ((*(int *)this != 0x32657066) && (*(int *)this != 0x33657066)) {
      uVar4._0_1_ = '\x05';
      uVar4._1_1_ = '\0';
      uVar4._2_1_ = '\0';
      uVar4._3_1_ = '\0';
      uVar4._4_1_ = '\0';
      uVar4._5_1_ = '\0';
      uVar4._6_1_ = '\0';
      uVar4._7_1_ = '\0';
      if (*(int *)this == 0x32706676) {
        pcVar2 = "vfpv2";
      }
      else if (*(int *)this == 0x33706676) {
        pcVar2 = "vfpv3";
      }
      else {
        if (*(int *)this != 0x34706676) {
          pcStack_50 = &DAT_00000004;
          goto switchD_00172861_caseD_5;
        }
        pcVar2 = "vfpv4";
      }
    }
    break;
  default:
    goto switchD_00172861_caseD_5;
  case (char *)0x8:
    if (*(long *)this == 0x6b6369726576616d) goto LAB_00172a15;
    uVar4._0_1_ = '\t';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar4._4_1_ = '\0';
    uVar4._5_1_ = '\0';
    uVar4._6_1_ = '\0';
    uVar4._7_1_ = '\0';
    if (*(long *)this != 0x3631642d33706676) {
      if (*(long *)this != 0x3631642d34706676) {
        pcStack_50 = (char *)0x8;
        goto switchD_00172861_caseD_5;
      }
      goto LAB_00172a2f;
    }
    pcVar2 = "vfpv3-d16";
    break;
  case (char *)0xa:
    iVar1 = bcmp(this,"fp4-sp-d16",10);
    uVar4._0_1_ = '\v';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar4._4_1_ = '\0';
    uVar4._5_1_ = '\0';
    uVar4._6_1_ = '\0';
    uVar4._7_1_ = '\0';
    if (iVar1 == 0) goto LAB_00172a22;
    iVar1 = bcmp(this,"fp4-dp-d16",10);
    if (iVar1 == 0) goto LAB_00172a2f;
    iVar1 = bcmp(this,"fp5-sp-d16",10);
    if (iVar1 == 0) {
      pcVar2 = "fpv5-sp-d16";
    }
    else {
      pcStack_50 = (char *)0xa;
      iVar1 = bcmp(this,"fp5-dp-d16",10);
      if (iVar1 == 0) goto LAB_00172a08;
      iVar1 = bcmp(this,"neon-vfpv3",10);
      if (iVar1 != 0) goto switchD_00172861_caseD_5;
      uVar4._0_1_ = '\x04';
      uVar4._1_1_ = '\0';
      uVar4._2_1_ = '\0';
      uVar4._3_1_ = '\0';
      uVar4._4_1_ = '\0';
      uVar4._5_1_ = '\0';
      uVar4._6_1_ = '\0';
      uVar4._7_1_ = '\0';
      pcVar2 = "neon";
    }
    break;
  case (char *)0xb:
    pcStack_50 = (char *)0xb;
    iVar1 = bcmp(this,"fpv4-dp-d16",0xb);
    if (iVar1 == 0) {
LAB_00172a2f:
      uVar4._0_1_ = '\t';
      uVar4._1_1_ = '\0';
      uVar4._2_1_ = '\0';
      uVar4._3_1_ = '\0';
      uVar4._4_1_ = '\0';
      uVar4._5_1_ = '\0';
      uVar4._6_1_ = '\0';
      uVar4._7_1_ = '\0';
      pcVar2 = "vfpv4-d16";
    }
    else {
      iVar1 = bcmp(this,"fpv5-dp-d16",0xb);
      if (iVar1 != 0) goto switchD_00172861_caseD_5;
LAB_00172a08:
      uVar4._0_1_ = '\b';
      uVar4._1_1_ = '\0';
      uVar4._2_1_ = '\0';
      uVar4._3_1_ = '\0';
      uVar4._4_1_ = '\0';
      uVar4._5_1_ = '\0';
      uVar4._6_1_ = '\0';
      uVar4._7_1_ = '\0';
      pcVar2 = "fpv5-d16";
    }
    break;
  case (char *)0xc:
    pcStack_50 = &DAT_0000000c;
    iVar1 = bcmp(this,"vfpv4-sp-d16",0xc);
    if (iVar1 != 0) goto switchD_00172861_caseD_5;
LAB_00172a22:
    uVar4._0_1_ = '\v';
    uVar4._1_1_ = '\0';
    uVar4._2_1_ = '\0';
    uVar4._3_1_ = '\0';
    uVar4._4_1_ = '\0';
    uVar4._5_1_ = '\0';
    uVar4._6_1_ = '\0';
    uVar4._7_1_ = '\0';
    pcVar2 = "fpv4-sp-d16";
  }
  local_28 = true;
  local_38 = pcVar2;
  local_30 = (char  [8])uVar4;
  pSVar3 = Optional<llvm::StringRef>::getPointer((Optional<llvm::StringRef> *)&local_38);
  this = (ARM *)pSVar3->Data;
  pcStack_50 = (char *)pSVar3->Length;
switchD_00172861_caseD_5:
  lVar5 = 0x10;
  while( true ) {
    if (lVar5 == 0x2d0) {
      return 0;
    }
    if ((pcStack_50 == *(char **)(&UNK_001c35e8 + lVar5)) &&
       ((pcStack_50 == (char *)0x0 ||
        (iVar1 = bcmp(this,*(void **)((long)&PTR_snprint_001c35e0 + lVar5),(size_t)pcStack_50),
        iVar1 == 0)))) break;
    lVar5 = lVar5 + 0x20;
  }
  return *(uint *)((long)&(anonymous_namespace)::FPUNames + lVar5);
}

Assistant:

unsigned llvm::ARM::parseFPU(StringRef FPU) {
  StringRef Syn = getFPUSynonym(FPU);
  for (const auto F : FPUNames) {
    if (Syn == F.getName())
      return F.ID;
  }
  return ARM::FK_INVALID;
}